

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_transaction_manager.cpp
# Opt level: O3

void __thiscall
duckdb::DuckTransactionManager::RollbackTransaction
          (DuckTransactionManager *this,Transaction *transaction_p)

{
  vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_true>
  *this_00;
  iterator *piVar1;
  _Elt_pointer puVar2;
  _Head_base<0UL,_duckdb::DuckCleanupInfo_*,_false> _Var3;
  undefined1 auVar4 [8];
  int iVar5;
  pointer pDVar6;
  FatalException *this_01;
  ErrorData error;
  undefined1 local_150 [8];
  _Alloc_hider local_148;
  undefined1 local_140 [8];
  char local_138 [16];
  _Alloc_hider local_128;
  char local_118 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_108 [56];
  undefined1 local_d0 [40];
  element_type *local_a8 [2];
  undefined1 local_98 [16];
  undefined1 local_88 [88];
  
  ErrorData::ErrorData((ErrorData *)(local_d0 + 0x20));
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)&this->transaction_lock);
  if (iVar5 != 0) {
    ::std::__throw_system_error(iVar5);
  }
  DuckTransaction::Rollback((ErrorData *)local_150,(DuckTransaction *)transaction_p);
  local_d0._32_2_ = local_150._0_2_;
  ::std::__cxx11::string::operator=((string *)local_a8,(string *)&local_148);
  ::std::__cxx11::string::operator=((string *)local_88,(string *)&local_128);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_M_move_assign((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)(local_88 + 0x20),local_108);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(local_108);
  if (local_128._M_p != local_118) {
    operator_delete(local_128._M_p);
  }
  if (local_148._M_p != local_138) {
    operator_delete(local_148._M_p);
  }
  RemoveTransaction((DuckTransactionManager *)local_150,(DuckTransaction *)this);
  pDVar6 = unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>,_true>::
           operator->((unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>,_true>
                       *)local_150);
  if ((pDVar6->transactions).
      super_vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pDVar6->transactions).
      super_vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    iVar5 = pthread_mutex_lock((pthread_mutex_t *)&this->cleanup_queue_lock);
    if (iVar5 != 0) {
      ::std::__throw_system_error(iVar5);
    }
    puVar2 = (this->cleanup_queue).c.
             super__Deque_base<duckdb::unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>,_true>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (puVar2 == (this->cleanup_queue).c.
                  super__Deque_base<duckdb::unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>,_true>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      ::std::
      deque<duckdb::unique_ptr<duckdb::DuckCleanupInfo,std::default_delete<duckdb::DuckCleanupInfo>,true>,std::allocator<duckdb::unique_ptr<duckdb::DuckCleanupInfo,std::default_delete<duckdb::DuckCleanupInfo>,true>>>
      ::
      _M_push_back_aux<duckdb::unique_ptr<duckdb::DuckCleanupInfo,std::default_delete<duckdb::DuckCleanupInfo>,true>>
                ((deque<duckdb::unique_ptr<duckdb::DuckCleanupInfo,std::default_delete<duckdb::DuckCleanupInfo>,true>,std::allocator<duckdb::unique_ptr<duckdb::DuckCleanupInfo,std::default_delete<duckdb::DuckCleanupInfo>,true>>>
                  *)&this->cleanup_queue,
                 (unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>,_true>
                  *)local_150);
    }
    else {
      (puVar2->
      super_unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>_>)._M_t
      .super___uniq_ptr_impl<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::DuckCleanupInfo_*,_std::default_delete<duckdb::DuckCleanupInfo>_>
      .super__Head_base<0UL,_duckdb::DuckCleanupInfo_*,_false>._M_head_impl =
           (DuckCleanupInfo *)local_150;
      local_150 = (undefined1  [8])0x0;
      piVar1 = &(this->cleanup_queue).c.
                super__Deque_base<duckdb::unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>,_true>_>_>
                ._M_impl.super__Deque_impl_data._M_finish;
      piVar1->_M_cur = piVar1->_M_cur + 1;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->cleanup_queue_lock);
  }
  auVar4 = local_150;
  if (local_150 != (undefined1  [8])0x0) {
    ::std::
    vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>_>_>
               *)((long)local_150 + 8));
    operator_delete((void *)auVar4);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->transaction_lock);
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)&this->cleanup_lock);
  if (iVar5 != 0) {
    ::std::__throw_system_error(iVar5);
  }
  local_150 = (undefined1  [8])0x0;
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)&this->cleanup_queue_lock);
  auVar4 = local_150;
  if (iVar5 != 0) {
    ::std::__throw_system_error(iVar5);
  }
  puVar2 = (this->cleanup_queue).c.
           super__Deque_base<duckdb::unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>,_true>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  if ((this->cleanup_queue).c.
      super__Deque_base<duckdb::unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>,_true>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur != puVar2) {
    _Var3._M_head_impl =
         (puVar2->
         super_unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>_>).
         _M_t.
         super___uniq_ptr_impl<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::DuckCleanupInfo_*,_std::default_delete<duckdb::DuckCleanupInfo>_>
         .super__Head_base<0UL,_duckdb::DuckCleanupInfo_*,_false>._M_head_impl;
    (puVar2->
    super_unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>_>)._M_t.
    super___uniq_ptr_impl<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::DuckCleanupInfo_*,_std::default_delete<duckdb::DuckCleanupInfo>_>
    .super__Head_base<0UL,_duckdb::DuckCleanupInfo_*,_false>._M_head_impl = (DuckCleanupInfo *)0x0;
    if ((_Tuple_impl<0UL,_duckdb::DuckCleanupInfo_*,_std::default_delete<duckdb::DuckCleanupInfo>_>)
        local_150 != (DuckCleanupInfo *)0x0) {
      this_00 = (vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_true>
                 *)((long)local_150 + 8);
      local_150 = (undefined1  [8])_Var3._M_head_impl;
      ::std::
      vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>_>_>
                 *)this_00);
      operator_delete((void *)auVar4);
      _Var3._M_head_impl = (DuckCleanupInfo *)local_150;
    }
    local_150 = (undefined1  [8])_Var3._M_head_impl;
    ::std::
    deque<duckdb::unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>,_true>_>_>
    ::pop_front(&(this->cleanup_queue).c);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->cleanup_queue_lock);
  if (local_150 != (undefined1  [8])0x0) {
    pDVar6 = unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>,_true>
             ::operator->((unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>,_true>
                           *)local_150);
    DuckCleanupInfo::Cleanup(pDVar6);
    auVar4 = local_150;
    if ((_Head_base<0UL,_duckdb::DuckCleanupInfo_*,_false>)local_150 !=
        (_Head_base<0UL,_duckdb::DuckCleanupInfo_*,_false>)0x0) {
      ::std::
      vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>_>_>
                 *)((long)local_150 + 8));
      operator_delete((void *)auVar4);
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->cleanup_lock);
  if ((bool)local_d0[0x20] != true) {
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)(local_88 + 0x20));
    if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
      operator_delete((void *)local_88._0_8_);
    }
    if (local_a8[0] != (element_type *)local_98) {
      operator_delete(local_a8[0]);
    }
    return;
  }
  this_01 = (FatalException *)__cxa_allocate_exception(0x10);
  local_150 = (undefined1  [8])local_140;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_150,
             "Failed to rollback transaction. Cannot continue operation.\nError: %s","");
  local_d0._0_8_ = local_d0 + 0x10;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_d0,local_88._0_8_,(undefined1 *)(local_88._8_8_ + local_88._0_8_));
  FatalException::FatalException<std::__cxx11::string>
            (this_01,(string *)local_150,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0);
  __cxa_throw(this_01,&FatalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void DuckTransactionManager::RollbackTransaction(Transaction &transaction_p) {
	auto &transaction = transaction_p.Cast<DuckTransaction>();

	ErrorData error;
	{
		// Obtain the transaction lock and roll back.
		lock_guard<mutex> t_lock(transaction_lock);
		error = transaction.Rollback();

		// Remove the transaction from the list of active transactions and gather cleanup information.
		auto cleanup_info = RemoveTransaction(transaction);
		if (cleanup_info->ScheduleCleanup()) {
			lock_guard<mutex> q_lock(cleanup_queue_lock);
			cleanup_queue.emplace(std::move(cleanup_info));
		}
	}

	{
		lock_guard<mutex> c_lock(cleanup_lock);
		unique_ptr<DuckCleanupInfo> top_cleanup_info;
		{
			lock_guard<mutex> q_lock(cleanup_queue_lock);
			if (!cleanup_queue.empty()) {
				top_cleanup_info = std::move(cleanup_queue.front());
				cleanup_queue.pop();
			}
		}
		if (top_cleanup_info) {
			top_cleanup_info->Cleanup();
		}
	}

	if (error.HasError()) {
		throw FatalException("Failed to rollback transaction. Cannot continue operation.\nError: %s", error.Message());
	}
}